

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O1

string * __thiscall
chaiscript::AST_Node::pretty_print_abi_cxx11_(string *__return_storage_ptr__,AST_Node *this)

{
  string *psVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  ostringstream oss;
  char local_1e9;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  long local_1d8;
  string *local_1d0;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(this->text)._M_dataplus._M_p,(this->text)._M_string_length);
  local_1d0 = __return_storage_ptr__;
  (**this->_vptr_AST_Node)(&local_1e8,this);
  if (local_1e8 != local_1e0) {
    puVar3 = local_1e8;
    do {
      pretty_print_abi_cxx11_(&local_1c8,(AST_Node *)*puVar3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length
                         );
      local_1e9 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1e9,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      puVar3 = puVar3 + 1;
    } while (puVar3 != local_1e0);
  }
  if (local_1e8 != (undefined8 *)0x0) {
    operator_delete(local_1e8,local_1d8 - (long)local_1e8);
  }
  psVar1 = local_1d0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string pretty_print() const {
      std::ostringstream oss;

      oss << text;

      for (auto &elem : get_children()) {
        oss << elem.get().pretty_print() << ' ';
      }

      return oss.str();
    }